

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_lexer.cpp
# Opt level: O2

void __thiscall Lexer::initializeTokenMaps(Lexer *this)

{
  char cVar1;
  CompilationContext *pCVar2;
  int i;
  long lVar3;
  char **ppcVar4;
  allocator local_91;
  Lexer *local_90;
  char **local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::_Select1st<std::pair<std::__cxx11::string_const,TokenType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
  *local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_58;
  
  if ((this->tokenIdentStringToType)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_60 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::_Select1st<std::pair<std::__cxx11::string_const,TokenType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
                *)&this->tokenIdentStringToType;
    ppcVar4 = token_strings;
    local_90 = this;
    for (lVar3 = 0; lVar3 != 99; lVar3 = lVar3 + 1) {
      cVar1 = **ppcVar4;
      if (cVar1 == '_' || (byte)(cVar1 + 0x9fU) < 0x1a) {
        std::__cxx11::string::string((string *)&local_80,*ppcVar4,&local_91);
        local_58.first._M_string_length = local_78;
        if (local_80 == &local_70) {
          local_58.first.field_2._8_8_ = local_70._8_8_;
          local_58.first._M_dataplus._M_p = (pointer)&local_58.first.field_2;
        }
        else {
          local_58.first._M_dataplus._M_p = (pointer)local_80;
        }
        local_58.first.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
        local_58.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        local_58.second = (TokenType)lVar3;
        local_88 = ppcVar4;
        local_80 = &local_70;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::_Select1st<std::pair<std::__cxx11::string_const,TokenType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,TokenType>>(local_60,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_80);
        pCVar2 = local_90->ctx;
        std::__cxx11::string::string((string *)&local_58,*local_88,(allocator *)&local_80);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pCVar2->stringList,&local_58.first);
        std::__cxx11::string::~string((string *)&local_58);
        ppcVar4 = local_88;
      }
      ppcVar4 = ppcVar4 + 1;
    }
  }
  return;
}

Assistant:

void Lexer::initializeTokenMaps()
{
  if (!tokenIdentStringToType.empty())
    return;

  for (int i = 0; i < int(TOKEN_TYPE_COUNT); i++)
    if ((token_strings[i][0] >= 'a' && token_strings[i][0] <= 'z') || token_strings[i][0] == '_')
    {
      tokenIdentStringToType.insert(std::make_pair<std::string, TokenType>(token_strings[i], TokenType(i)));
      ctx.stringList.insert(token_strings[i]);
    }
}